

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O1

Vec_Bit_t * Gia_ManGenUsed(Gia_Man_t *p,int fBuf)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Vec_Bit_t *pVVar4;
  byte *__s;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  Gia_Obj_t *pGVar10;
  int iVar11;
  
  iVar11 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  pVVar4 = (Vec_Bit_t *)malloc(0x10);
  pVVar4->nSize = 0;
  iVar9 = iVar11 * 0x20;
  pVVar4->nCap = iVar9;
  if (iVar11 == 0) {
    __s = (byte *)0x0;
  }
  else {
    __s = (byte *)malloc((long)iVar11 * 4);
  }
  pVVar4->pArray = (int *)__s;
  pVVar4->nSize = iVar9;
  memset(__s,0,(long)iVar11 << 2);
  uVar7 = p->nObjs;
  if ((0 < (int)uVar7) && (pGVar10 = p->pObjs, pGVar10 != (Gia_Obj_t *)0x0)) {
    uVar5 = 0;
    do {
      if ((~*(uint *)pGVar10 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar10) {
        if (fBuf != 0) {
          if ((long)iVar9 <= (long)uVar5) goto LAB_0021b6a3;
          *(uint *)(__s + (uVar5 >> 5 & 0x7ffffff) * 4) =
               *(uint *)(__s + (uVar5 >> 5 & 0x7ffffff) * 4) | 1 << ((byte)uVar5 & 0x1f);
        }
        if ((*(uint *)pGVar10 >> 0x1d & 1) != fBuf) {
          lVar8 = -(*(uint *)pGVar10 & 0x1fffffff) + uVar5;
          uVar6 = (uint)lVar8;
          if (((int)uVar6 < 0) || (iVar9 <= (int)uVar6)) goto LAB_0021b6a3;
          *(uint *)(__s + (ulong)(uVar6 >> 5) * 4) =
               *(uint *)(__s + (ulong)(uVar6 >> 5) * 4) | 1 << ((byte)lVar8 & 0x1f);
        }
        uVar6 = (uint)((ulong)*(undefined8 *)pGVar10 >> 0x20);
        if ((uVar6 >> 0x1d & 1) != fBuf) {
          lVar8 = -(uVar6 & 0x1fffffff) + uVar5;
          uVar6 = (uint)lVar8;
          if (((int)uVar6 < 0) || (iVar9 <= (int)uVar6)) goto LAB_0021b6a3;
          *(uint *)(__s + (ulong)(uVar6 >> 5) * 4) =
               *(uint *)(__s + (ulong)(uVar6 >> 5) * 4) | 1 << ((byte)lVar8 & 0x1f);
        }
      }
      uVar5 = uVar5 + 1;
      pGVar10 = pGVar10 + 1;
    } while (uVar7 != uVar5);
  }
  pVVar2 = p->vCos;
  if (0 < pVVar2->nSize) {
    piVar3 = pVVar2->pArray;
    lVar8 = 0;
    while( true ) {
      iVar1 = piVar3[lVar8];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar7 = *(uint *)(p->pObjs + iVar1);
      if ((uVar7 >> 0x1d & 1) != fBuf) {
        if (p->nObjs <= iVar1) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar7 = iVar1 - (uVar7 & 0x1fffffff);
        if (((int)uVar7 < 0) || (iVar9 <= (int)uVar7)) goto LAB_0021b6a3;
        *(uint *)(__s + (ulong)(uVar7 >> 5) * 4) =
             *(uint *)(__s + (ulong)(uVar7 >> 5) * 4) | 1 << ((byte)uVar7 & 0x1f);
      }
      lVar8 = lVar8 + 1;
      if (pVVar2->nSize <= lVar8) break;
    }
  }
  if (0 < iVar11) {
    *__s = *__s & 0xfe;
    return pVVar4;
  }
LAB_0021b6a3:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
}

Assistant:

Vec_Bit_t * Gia_ManGenUsed( Gia_Man_t * p, int fBuf )
{
    Gia_Obj_t * pObj; int i;
    Vec_Bit_t * vUsed = Vec_BitStart( Gia_ManObjNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( fBuf )
            Vec_BitWriteEntry( vUsed, i, 1 );
        if ( Gia_ObjFaninC0(pObj) ^ fBuf )
            Vec_BitWriteEntry( vUsed, Gia_ObjFaninId0(pObj, i), 1 );
        if ( Gia_ObjFaninC1(pObj) ^ fBuf )
            Vec_BitWriteEntry( vUsed, Gia_ObjFaninId1(pObj, i), 1 );
    }
    Gia_ManForEachCo( p, pObj, i )
        if ( Gia_ObjFaninC0(pObj) ^ fBuf )
            Vec_BitWriteEntry( vUsed, Gia_ObjFaninId0p(p, pObj), 1 );
    Vec_BitWriteEntry( vUsed, 0, 0 ); // clean zero
    return vUsed;
}